

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 10.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int local_18;
  char acStack_14 [4];
  int x;
  char eme [8];
  
  eme[0] = '\0';
  eme[1] = '\0';
  eme[2] = '\0';
  eme[3] = '\0';
  _acStack_14 = 0x6d32333b315b1b;
  std::operator<<((ostream *)&std::cout,acStack_14);
  std::operator<<((ostream *)&std::cout,
                  "Summum bonum ( \'sumo bem\' ou \'bem maior, em latim) eh uma expressao latina usada na filosofia - particularmente, em Aristoteles "
                 );
  poVar1 = std::operator<<((ostream *)&std::cout,
                           ",na filosofia medieval e na filosofia de Immanuel Kant - para descrever o bem maior que o ser humano deve buscar."
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Voce se considera sujeito ao \'Summum Bonum\'(digite 1 pra sim e 0 pra nao)?"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,&local_18);
  if (local_18 == 1) {
    std::operator<<((ostream *)&std::cout,
                    "Parabens.Summum Bonum eh o maximo do bem que eh um fim em si.");
  }
  else {
    std::operator<<((ostream *)&std::cout,
                    "Nada mal. A natureza desse estado preocupou muitos autores, dentre eles cristaos."
                   );
  }
  return 0;
}

Assistant:

int main()
{
    char eme[] = {0x1b, '[', '1', ';', '3', '2', 'm', 0};
    cout << eme;
    int x;
    cout << "Summum bonum ( 'sumo bem' ou 'bem maior, em latim) eh uma expressao latina usada na filosofia - particularmente, em Aristoteles ";
    cout << ",na filosofia medieval e na filosofia de Immanuel Kant - para descrever o bem maior que o ser humano deve buscar." << endl
         << endl;
    cout << "Voce se considera sujeito ao 'Summum Bonum'(digite 1 pra sim e 0 pra nao)?" << endl;
    cin >> x;

    if (x == true)
    {
        cout << "Parabens.Summum Bonum eh o maximo do bem que eh um fim em si.";
    }
    else
    {
        cout << "Nada mal. A natureza desse estado preocupou muitos autores, dentre eles cristaos.";
    }

    return 0;
}